

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_crypto.c
# Opt level: O1

void test_archive_sha512(void)

{
  int iVar1;
  long lVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  uchar buf [1];
  archive_sha512_ctx ctx;
  uchar actualmd [65];
  uchar md [64];
  undefined1 local_ca;
  archive_sha512_ctx local_c9;
  undefined8 local_c8 [8];
  undefined1 local_88;
  undefined1 local_78 [72];
  
  local_ca = 0;
  puVar3 = &DAT_00241980;
  puVar4 = local_c8;
  for (lVar2 = 8; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *puVar3;
    puVar3 = puVar3 + 1;
    puVar4 = puVar4 + 1;
  }
  local_88 = 0;
  iVar1 = __archive_stub_sha512init(&local_c9);
  if (iVar1 == 0) {
    iVar1 = __archive_stub_sha512update(&local_c9,&local_ca,1);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_crypto.c"
                        ,L'\x8e',0,"ARCHIVE_OK",(long)iVar1,
                        "archive_sha512_update(&ctx, buf, sizeof(buf))",(void *)0x0);
    iVar1 = __archive_stub_sha512final(&local_c9,local_78);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_crypto.c"
                        ,L'\x8f',0,"ARCHIVE_OK",(long)iVar1,"archive_sha512_final(&ctx, md)",
                        (void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_crypto.c"
                        ,L'\x90',local_78,"md",local_c8,"actualmd",0x40,"sizeof(md)",(void *)0x0);
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_crypto.c"
                   ,L'\x8b');
    test_skipping("This platform does not support SHA512");
  }
  return;
}

Assistant:

DEFINE_TEST(test_archive_sha512)
{
	archive_sha512_ctx ctx;
	unsigned char buf[] = "";
	unsigned char md[64];
	unsigned char actualmd[] = "\xb8\x24\x4d\x02\x89\x81\xd6\x93"
                             "\xaf\x7b\x45\x6a\xf8\xef\xa4\xca"
                             "\xd6\x3d\x28\x2e\x19\xff\x14\x94"
                             "\x2c\x24\x6e\x50\xd9\x35\x1d\x22"
                             "\x70\x4a\x80\x2a\x71\xc3\x58\x0b"
                             "\x63\x70\xde\x4c\xeb\x29\x3c\x32"
                             "\x4a\x84\x23\x34\x25\x57\xd4\xe5"
                             "\xc3\x84\x38\xf0\xe3\x69\x10\xee";

	if (ARCHIVE_OK != archive_sha512_init(&ctx)) {
		skipping("This platform does not support SHA512");
		return;
	}
	assertEqualInt(ARCHIVE_OK, archive_sha512_update(&ctx, buf, sizeof(buf)));
	assertEqualInt(ARCHIVE_OK, archive_sha512_final(&ctx, md));
	assertEqualMem(md, actualmd, sizeof(md));
}